

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtils.hpp
# Opt level: O0

string * OpenMD::toString<int>(int *v)

{
  byte bVar1;
  long *plVar2;
  ostream *this;
  int *in_RSI;
  string *in_RDI;
  ostringstream oss;
  ostringstream local_188 [376];
  int *local_10;
  
  local_10 = in_RSI;
  std::__cxx11::ostringstream::ostringstream(local_188);
  plVar2 = (long *)std::ostream::operator<<(local_188,*local_10);
  bVar1 = std::ios::operator!((ios *)((long)plVar2 + *(long *)(*plVar2 + -0x18)));
  if ((bVar1 & 1) != 0) {
    this = std::operator<<((ostream *)&std::cerr,"toString Error");
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return in_RDI;
}

Assistant:

std::string toString(const T& v) {
    std::ostringstream oss;
    if (!(oss << v)) { std::cerr << "toString Error" << std::endl; }
    return oss.str();
  }